

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

bool __thiscall cmFindLibraryHelper::HasValidSuffix(cmFindLibraryHelper *this,string *name)

{
  bool bVar1;
  __type _Var2;
  reference pbVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_5c;
  undefined1 local_58 [8];
  string suffix;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *name_local;
  cmFindLibraryHelper *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Suffixes);
  suffix.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->Suffixes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&suffix.field_2 + 8)), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_58,(string *)pbVar3);
    uVar4 = std::__cxx11::string::length();
    uVar5 = std::__cxx11::string::length();
    if (uVar5 < uVar4) {
      std::__cxx11::string::size();
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_80,(ulong)name);
      _Var2 = std::operator==(&local_80,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58);
      std::__cxx11::string::~string((string *)&local_80);
      if (_Var2) {
        this_local._7_1_ = 1;
        local_5c = 1;
      }
      else {
        std::__cxx11::string::operator+=((string *)local_58,".");
        lVar6 = std::__cxx11::string::find((string *)name,(ulong)local_58);
        if (lVar6 == -1) {
          local_5c = 0;
        }
        else {
          this_local._7_1_ = 1;
          local_5c = 1;
        }
      }
    }
    else {
      local_5c = 3;
    }
    std::__cxx11::string::~string((string *)local_58);
    if ((local_5c != 0) && (local_5c == 1)) goto LAB_002a9575;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 0;
LAB_002a9575:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFindLibraryHelper::HasValidSuffix(std::string const& name)
{
  for (std::string suffix : this->Suffixes) {
    if (name.length() <= suffix.length()) {
      continue;
    }
    // Check if the given name ends in a valid library suffix.
    if (name.substr(name.size() - suffix.length()) == suffix) {
      return true;
    }
    // Check if a valid library suffix is somewhere in the name,
    // this may happen e.g. for versioned shared libraries: libfoo.so.2
    suffix += ".";
    if (name.find(suffix) != std::string::npos) {
      return true;
    }
  }
  return false;
}